

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

void __thiscall
CVmObjByteArray::move_bytes
          (CVmObjByteArray *this,unsigned_long dst_idx,unsigned_long src_idx,unsigned_long cnt)

{
  char *pcVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  void *pvVar10;
  
  if (src_idx <= dst_idx) {
    lVar7 = cnt + src_idx;
    lVar9 = cnt + dst_idx;
    uVar5 = (cnt + src_idx) - 2;
    pcVar1 = (this->super_CVmObject).ext_;
    pvVar3 = (void *)(*(long *)(*(long *)(pcVar1 + (uVar5 >> 0x1c) * 8 + 4) +
                               (ulong)((uint)(uVar5 >> 0xc) & 0xfff8)) + (uVar5 & 0x7fff) + 1);
    uVar6 = (cnt + dst_idx) - 2;
    pvVar10 = (void *)(*(long *)(*(long *)(pcVar1 + (uVar6 >> 0x1c) * 8 + 4) +
                                (ulong)((uint)(uVar6 >> 0xc) & 0xfff8)) + (uVar6 & 0x7fff) + 1);
    uVar5 = (uVar5 | 0xffffffffffff8000) + 0x8001;
    uVar6 = (uVar6 | 0xffffffffffff8000) + 0x8001;
    while( true ) {
      if (cnt == 0) {
        return;
      }
      uVar8 = uVar5;
      if (cnt < uVar5) {
        uVar8 = cnt;
      }
      if (uVar6 <= uVar8) {
        uVar8 = uVar6;
      }
      pvVar10 = (void *)((long)pvVar10 - uVar8);
      pvVar3 = (void *)((long)pvVar3 - uVar8);
      memmove(pvVar10,pvVar3,uVar8);
      cnt = cnt - uVar8;
      if (cnt == 0) break;
      lVar7 = lVar7 - uVar8;
      uVar5 = uVar5 - uVar8;
      if (uVar5 == 0) {
        uVar5 = lVar7 - 2;
        pvVar3 = (void *)(*(long *)(*(long *)((this->super_CVmObject).ext_ + (uVar5 >> 0x1c) * 8 + 4
                                             ) + (ulong)((uint)uVar5 >> 0xc & 0xfff8)) +
                          (ulong)((uint)uVar5 & 0x7fff) + 1);
        uVar5 = (uVar5 | 0xffffffffffff8000) + 0x8001;
      }
      uVar6 = uVar6 - uVar8;
      lVar9 = lVar9 - uVar8;
      if (uVar6 == 0) {
        uVar6 = lVar9 - 2;
        pvVar10 = (void *)(*(long *)(*(long *)((this->super_CVmObject).ext_ +
                                              (uVar6 >> 0x1c) * 8 + 4) +
                                    (ulong)((uint)uVar6 >> 0xc & 0xfff8)) +
                           (ulong)((uint)uVar6 & 0x7fff) + 1);
        uVar6 = (uVar6 | 0xffffffffffff8000) + 0x8001;
      }
    }
    return;
  }
  uVar2 = (uint)(src_idx - 1);
  uVar5 = (ulong)(uVar2 & 0x7fff);
  uVar6 = 0x8000 - uVar5;
  pcVar1 = (this->super_CVmObject).ext_;
  pvVar3 = (void *)(uVar5 + *(long *)(*(long *)(pcVar1 + (src_idx - 1 >> 0x1c) * 8 + 4) +
                                     (ulong)(uVar2 >> 0xc & 0xfff8)));
  uVar5 = dst_idx - 1;
  pcVar1 = pcVar1 + (uVar5 >> 0x1c) * 8;
  do {
    uVar4 = (ulong)((uint)uVar5 & 0x7fff);
    uVar8 = 0x8000 - uVar4;
    pvVar10 = (void *)(uVar4 + *(long *)(*(long *)(pcVar1 + 4) +
                                        (ulong)((uint)uVar5 >> 0xc & 0xfff8)));
    do {
      if (cnt == 0) {
        return;
      }
      uVar5 = uVar6;
      if (cnt < uVar6) {
        uVar5 = cnt;
      }
      if (uVar8 <= uVar5) {
        uVar5 = uVar8;
      }
      memmove(pvVar10,pvVar3,uVar5);
      cnt = cnt - uVar5;
      if (cnt == 0) {
        return;
      }
      src_idx = src_idx + uVar5;
      uVar6 = uVar6 - uVar5;
      if (uVar6 == 0) {
        uVar2 = (uint)(src_idx - 1);
        uVar4 = (ulong)(uVar2 & 0x7fff);
        uVar6 = 0x8000 - uVar4;
        pvVar3 = (void *)(uVar4 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                     (src_idx - 1 >> 0x1c) * 8 + 4) +
                                           (ulong)(uVar2 >> 0xc & 0xfff8)));
      }
      else {
        pvVar3 = (void *)((long)pvVar3 + uVar5);
      }
      pvVar10 = (void *)((long)pvVar10 + uVar5);
      uVar8 = uVar8 - uVar5;
      dst_idx = dst_idx + uVar5;
    } while (uVar8 != 0);
    uVar5 = dst_idx - 1;
    pcVar1 = (this->super_CVmObject).ext_ + (uVar5 >> 0x1c) * 8;
  } while( true );
}

Assistant:

void CVmObjByteArray::move_bytes(unsigned long dst_idx,
                                 unsigned long src_idx,
                                 unsigned long cnt)
{
    size_t src_avail;
    size_t dst_avail;
    unsigned char *srcp;
    unsigned char *dstp;

    /* 
     *   If the destination is before the source, we're moving bytes down,
     *   so we must start at the low end and work forwards through the
     *   array.  If the destination is after the source, we're moving bytes
     *   up, so we must start at the high end and work backwards through the
     *   array.  
     */
    if (dst_idx < src_idx)
    {

        /* 
         *   Moving bytes down in the array - start at the low end and work
         *   forwards through the array.  Get the starting pointers and
         *   available lengths.  
         */
        srcp = get_ele_ptr(src_idx, &src_avail);
        dstp = get_ele_ptr(dst_idx, &dst_avail);

        /* keep going until we've moved all of the bytes requested */
        while (cnt != 0)
        {
            size_t move_len;

            /* 
             *   figure the largest amount we can move - we can move the
             *   smallest of the remaining requested move size, the source
             *   chunk, and the destination chunk 
             */
            move_len = cnt;
            if (move_len > src_avail)
                move_len = src_avail;
            if (move_len > dst_avail)
                move_len = dst_avail;

            /* move the data */
            memmove(dstp, srcp, move_len);

            /* advance all of the counters by the move size */
            srcp += move_len;
            dstp += move_len;
            cnt -= move_len;
            src_avail -= move_len;
            dst_avail -= move_len;
            src_idx += move_len;
            dst_idx += move_len;

            /* stop if we're done */
            if (cnt == 0)
                break;

            /* if the source chunk is at an end, get the next one */
            if (src_avail == 0)
                srcp = get_ele_ptr(src_idx, &src_avail);

            /* if the destination chunk is at an end, get the next one */
            if (dst_avail == 0)
                dstp = get_ele_ptr(dst_idx, &dst_avail);
        }
    }
    else
    {
        /* 
         *   We're to move bytes up in the array - start at the high end and
         *   work backwards through the array.  Advance each index to one
         *   past the last byte of its range.  
         */
        src_idx += cnt;
        dst_idx += cnt;

        /* get the chunk pointers */
        srcp = get_ele_ptr(src_idx - 1, &src_avail) + 1;
        dstp = get_ele_ptr(dst_idx - 1, &dst_avail) + 1;

        /* 
         *   since we're working backwards, we actually want to know the
         *   number of bytes on the page *before* the current pointers, so
         *   subtract the available spaces from the size of the page to get
         *   the available space preceding each 
         */
        src_avail = 32*1024 - src_avail + 1;
        dst_avail = 32*1024 - dst_avail + 1;

        /* keep going until we've moved all of the requested bytes */
        while (cnt != 0)
        {
            size_t move_len;

            /* 
             *   figure the largest amount we can move - we can move the
             *   smallest of the remaining requested move size, the source
             *   chunk, and the destination chunk 
             */
            move_len = cnt;
            if (move_len > src_avail)
                move_len = src_avail;
            if (move_len > dst_avail)
                move_len = dst_avail;

            /* move the data */
            memmove(dstp - move_len, srcp - move_len, move_len);

            /* advance all of the counters by the move size */
            srcp -= move_len;
            dstp -= move_len;
            cnt -= move_len;
            src_avail -= move_len;
            dst_avail -= move_len;
            src_idx -= move_len;
            dst_idx -= move_len;

            /* stop if we're done */
            if (cnt == 0)
                break;

            /* if we've exhausted the source chunk, get the next one */
            if (src_avail == 0)
            {
                srcp = get_ele_ptr(src_idx - 1, &src_avail) + 1;
                src_avail = 32*1024 - src_avail + 1;
            }

            /* if we've exhausted the destination chunk, get the next one */
            if (dst_avail == 0)
            {
                dstp = get_ele_ptr(dst_idx - 1, &dst_avail) + 1;
                dst_avail = 32*1024 - dst_avail + 1;
            }
        }
    }
}